

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char ** stb_getopt_param(int *argc,char **argv,char *param)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  int local_9c;
  int local_90;
  int local_88;
  int local_84;
  int local_74;
  int local_6c;
  int len;
  char z;
  char *t;
  char *s;
  char *q;
  int local_38;
  int k;
  int j;
  int i;
  char **opts;
  char *param_local;
  char **argv_local;
  int *argc_local;
  
  _j = (char **)0x0;
  local_38 = 1;
  opts = (char **)param;
  param_local = (char *)argv;
  argv_local = (char **)argc;
  for (k = 1; k < *(int *)argv_local; k = k + 1) {
    if (**(char **)(param_local + (long)k * 8) == '-') {
      if (*(char *)(*(long *)(param_local + (long)k * 8) + 1) == '\0') goto LAB_001c9025;
      lVar2 = *(long *)(param_local + (long)k * 8);
      for (q._4_4_ = 1; *(char *)(lVar2 + q._4_4_) != '\0'; q._4_4_ = q._4_4_ + 1) {
        pcVar3 = strchr((char *)opts,(int)*(char *)(lVar2 + q._4_4_));
        if (pcVar3 == (char *)0x0) {
          t = (char *)malloc(2);
          if (t == (char *)0x0) {
            return (char **)0x0;
          }
          *t = *(char *)(lVar2 + q._4_4_);
          t[1] = '\0';
        }
        else {
          _len = (char *)(lVar2 + (q._4_4_ + 1));
          cVar1 = *(char *)(lVar2 + q._4_4_);
          if (*_len == '\0') {
            if (k == *(int *)argv_local + -1) {
              *(undefined4 *)argv_local = 0;
              stb_getopt_free(_j);
              return (char **)0x0;
            }
            k = k + 1;
            _len = *(char **)(param_local + (long)k * 8);
          }
          else {
            sVar4 = strlen(_len);
            q._4_4_ = q._4_4_ + (int)sVar4;
          }
          sVar4 = strlen(_len);
          t = (char *)malloc((long)((int)sVar4 + 2));
          if (t == (char *)0x0) {
            return (char **)0x0;
          }
          *t = cVar1;
          strcpy(t + 1,_len);
        }
        if (_j == (char **)0x0) {
          local_6c = 0;
        }
        else {
          local_6c = *(int *)(_j + -2);
        }
        if (_j == (char **)0x0) {
          local_74 = 0;
        }
        else {
          local_74 = *(int *)((long)_j + -0xc);
        }
        if (local_74 < local_6c + 1) {
          stb__arr_addlen_((void **)&j,8,1);
        }
        else {
          *(int *)(_j + -2) = *(int *)(_j + -2) + 1;
        }
        if (_j == (char **)0x0) {
          local_84 = 0;
        }
        else {
          local_84 = *(int *)(_j + -2);
        }
        _j[(long)local_84 + -1] = t;
      }
    }
    else {
      *(undefined8 *)(param_local + (long)local_38 * 8) = *(undefined8 *)(param_local + (long)k * 8)
      ;
      local_38 = local_38 + 1;
    }
  }
LAB_001c9291:
  if (_j == (char **)0x0) {
    local_88 = 0;
  }
  else {
    local_88 = *(int *)(_j + -2);
  }
  if (_j == (char **)0x0) {
    local_90 = 0;
  }
  else {
    local_90 = *(int *)((long)_j + -0xc);
  }
  if (local_90 < local_88 + 1) {
    stb__arr_addlen_((void **)&j,8,1);
  }
  else {
    *(int *)(_j + -2) = *(int *)(_j + -2) + 1;
  }
  if (_j == (char **)0x0) {
    local_9c = 0;
  }
  else {
    local_9c = *(int *)(_j + -2);
  }
  _j[(long)local_9c + -1] = (char *)0x0;
  *(int *)argv_local = local_38;
  return _j;
LAB_001c9025:
  while (k = k + 1, k < *(int *)argv_local) {
    *(undefined8 *)(param_local + (long)local_38 * 8) = *(undefined8 *)(param_local + (long)k * 8);
    local_38 = local_38 + 1;
  }
  goto LAB_001c9291;
}

Assistant:

char **stb_getopt_param(int *argc, char **argv, char *param)
{
   char ** opts=NULL;
   int i,j=1;
   for (i=1; i < *argc; ++i) {
      if (argv[i][0] != '-') {
         argv[j++] = argv[i];
      } else {
         if (argv[i][1] == 0) { // plain - == don't parse further options
            ++i;
            while (i < *argc)
               argv[j++] = argv[i++];
            break;
         } else {
            int k;
            char *q = argv[i];  // traverse options list
            for (k=1; q[k]; ++k) {
               char *s;
               if (strchr(param, q[k])) {  // does it take a parameter?
                  char *t = &q[k+1], z = q[k];
                  int len=0;
                  if (*t == 0) {
                     if (i == *argc-1) { // takes a parameter, but none found
                        *argc = 0;
                        stb_getopt_free(opts);
                        return NULL;
                     }
                     t = argv[++i];
                  } else
                     k += strlen(t);
                  len = strlen(t);
                  s = (char *) malloc(len+2);
                  if (!s) return NULL;
                  s[0] = z;
                  strcpy(s+1, t);
               } else {
                  // no parameter
                  s = (char *) malloc(2);
                  if (!s) return NULL;
                  s[0] = q[k];
                  s[1] = 0;
               }
               stb_arr_push(opts, s);
            }
         }
      }
   }
   stb_arr_push(opts, NULL);
   *argc = j;
   return opts;
}